

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O2

void __thiscall QtMWidgets::Picker::setModel(Picker *this,QAbstractItemModel *model)

{
  QAbstractItemModel *pQVar1;
  int iVar2;
  ItemFlags IVar3;
  PickerPrivate *pPVar4;
  ConnectionType type;
  int index;
  QModelIndex local_a8;
  char *local_90;
  Object local_88 [8];
  Object local_80 [8];
  Object local_78 [8];
  Object local_70 [8];
  Object local_68 [8];
  Object local_60 [8];
  Object local_58 [8];
  Object local_50 [8];
  QModelIndex local_48;
  
  if (model == (QAbstractItemModel *)0x0) {
    local_a8.r = 2;
    local_a8.m._4_4_ = 0;
    local_a8.c = 0;
    local_a8.i._0_4_ = 0;
    local_a8.i._4_4_ = 0;
    local_a8.m._0_4_ = 0;
    local_90 = "default";
    QMessageLogger::warning((char *)&local_a8,"QtMWidgets::Picker::setModel: cannot set a 0 model");
  }
  else {
    pPVar4 = (this->d).d;
    if (pPVar4->model != (Object *)0x0) {
      QObject::
      disconnect<void(QAbstractItemModel::*)(QModelIndex_const&,QModelIndex_const&,QList<int>const&),void(QtMWidgets::Picker::*)(QModelIndex_const&,QModelIndex_const&)>
                (pPVar4->model,(offset_in_QAbstractItemModel_to_subr)QAbstractItemModel::dataChanged
                 ,(Object *)0x0,(Function)this);
      QObject::
      disconnect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QtMWidgets::Picker::*)()>
                (((this->d).d)->model,
                 (offset_in_QAbstractItemModel_to_subr)QAbstractItemModel::rowsAboutToBeInserted,
                 (Object *)0x0,(Function)this);
      QObject::
      disconnect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QtMWidgets::Picker::*)(QModelIndex_const&,int,int)>
                (((this->d).d)->model,
                 (offset_in_QAbstractItemModel_to_subr)QAbstractItemModel::rowsInserted,
                 (Object *)0x0,(Function)this);
      QObject::
      disconnect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QtMWidgets::Picker::*)()>
                (((this->d).d)->model,
                 (offset_in_QAbstractItemModel_to_subr)QAbstractItemModel::rowsAboutToBeRemoved,
                 (Object *)0x0,(Function)this);
      QObject::
      disconnect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QtMWidgets::Picker::*)(QModelIndex_const&,int,int)>
                (((this->d).d)->model,
                 (offset_in_QAbstractItemModel_to_subr)QAbstractItemModel::rowsRemoved,(Object *)0x0
                 ,(Function)this);
      QObject::disconnect<void(QObject::*)(QObject*),void(QtMWidgets::Picker::*)()>
                ((Object *)((this->d).d)->model,(offset_in_QObject_to_subr)QObject::destroyed,
                 (Object *)0x0,(Function)this);
      QObject::
      disconnect<void(QAbstractItemModel::*)(QAbstractItemModel::QPrivateSignal),void(QtMWidgets::Picker::*)()>
                (((this->d).d)->model,
                 (offset_in_QAbstractItemModel_to_subr)QAbstractItemModel::modelAboutToBeReset,
                 (Object *)0x0,(Function)this);
      QObject::
      disconnect<void(QAbstractItemModel::*)(QAbstractItemModel::QPrivateSignal),void(QtMWidgets::Picker::*)()>
                (((this->d).d)->model,
                 (offset_in_QAbstractItemModel_to_subr)QAbstractItemModel::modelReset,(Object *)0x0,
                 (Function)this);
      pPVar4 = (this->d).d;
      if (*(Picker **)(*(long *)(pPVar4->model + 8) + 0x10) == this) {
        (**(code **)(*(long *)pPVar4->model + 0x20))();
        pPVar4 = (this->d).d;
      }
    }
    pPVar4->model = model;
    local_a8.r = 0x17c8c6;
    local_a8.c = 0;
    local_a8.i._0_4_ = 0;
    local_a8.i._4_4_ = 0;
    index = 0;
    type = (ConnectionType)this;
    QObject::
    connect<void(QAbstractItemModel::*)(QModelIndex_const&,QModelIndex_const&,QList<int>const&),void(QtMWidgets::Picker::*)(QModelIndex_const&,QModelIndex_const&)>
              (local_50,(offset_in_QAbstractItemModel_to_subr)model,
               (Object *)QAbstractItemModel::dataChanged,0,type);
    QMetaObject::Connection::~Connection((Connection *)local_50);
    local_a8.r = 0x17ca00;
    local_a8.c = 0;
    local_a8.i._0_4_ = 0;
    local_a8.i._4_4_ = 0;
    QObject::
    connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QtMWidgets::Picker::*)()>
              (local_58,(offset_in_QAbstractItemModel_to_subr)model,
               (Object *)QAbstractItemModel::rowsAboutToBeInserted,0,type);
    QMetaObject::Connection::~Connection((Connection *)local_58);
    local_a8.r = 0x17ca1a;
    local_a8.c = 0;
    local_a8.i._0_4_ = 0;
    local_a8.i._4_4_ = 0;
    QObject::
    connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QtMWidgets::Picker::*)(QModelIndex_const&,int,int)>
              (local_60,(offset_in_QAbstractItemModel_to_subr)model,
               (Object *)QAbstractItemModel::rowsInserted,0,type);
    QMetaObject::Connection::~Connection((Connection *)local_60);
    local_a8.r = 0x17ca00;
    local_a8.c = 0;
    local_a8.i._0_4_ = 0;
    local_a8.i._4_4_ = 0;
    QObject::
    connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QtMWidgets::Picker::*)()>
              (local_68,(offset_in_QAbstractItemModel_to_subr)model,
               (Object *)QAbstractItemModel::rowsAboutToBeRemoved,0,type);
    QMetaObject::Connection::~Connection((Connection *)local_68);
    local_a8.r = 0x17cb32;
    local_a8.c = 0;
    local_a8.i._0_4_ = 0;
    local_a8.i._4_4_ = 0;
    QObject::
    connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QtMWidgets::Picker::*)(QModelIndex_const&,int,int)>
              (local_70,(offset_in_QAbstractItemModel_to_subr)model,
               (Object *)QAbstractItemModel::rowsRemoved,0,type);
    QMetaObject::Connection::~Connection((Connection *)local_70);
    local_a8.r = 0x17c6b4;
    local_a8.c = 0;
    local_a8.i._0_4_ = 0;
    local_a8.i._4_4_ = 0;
    QObject::connect<void(QObject::*)(QObject*),void(QtMWidgets::Picker::*)()>
              (local_78,(offset_in_QObject_to_subr)model,(Object *)QObject::destroyed,0,type);
    QMetaObject::Connection::~Connection((Connection *)local_78);
    local_a8.r = 0x17ca00;
    local_a8.c = 0;
    local_a8.i._0_4_ = 0;
    local_a8.i._4_4_ = 0;
    QObject::
    connect<void(QAbstractItemModel::*)(QAbstractItemModel::QPrivateSignal),void(QtMWidgets::Picker::*)()>
              (local_80,(offset_in_QAbstractItemModel_to_subr)model,
               (Object *)QAbstractItemModel::modelAboutToBeReset,0,type);
    QMetaObject::Connection::~Connection((Connection *)local_80);
    local_a8.r = 0x17cc64;
    local_a8.c = 0;
    local_a8.i._0_4_ = 0;
    local_a8.i._4_4_ = 0;
    QObject::
    connect<void(QAbstractItemModel::*)(QAbstractItemModel::QPrivateSignal),void(QtMWidgets::Picker::*)()>
              (local_88,(offset_in_QAbstractItemModel_to_subr)model,
               (Object *)QAbstractItemModel::modelReset,0,type);
    QMetaObject::Connection::~Connection((Connection *)local_88);
    iVar2 = count(this);
    if (iVar2 != 0) {
      for (; iVar2 = count(this), index < iVar2; index = index + 1) {
        pPVar4 = (this->d).d;
        pQVar1 = pPVar4->model;
        iVar2 = pPVar4->modelColumn;
        QPersistentModelIndex::operator_cast_to_QModelIndex(&local_48,&pPVar4->root);
        (**(code **)(*(long *)pQVar1 + 0x60))(&local_a8,pQVar1,index,iVar2,&local_48);
        IVar3 = QModelIndex::flags(&local_a8);
        if ((IVar3.i & 0x20) != 0) {
          pPVar4 = (this->d).d;
          pQVar1 = pPVar4->model;
          iVar2 = pPVar4->modelColumn;
          QPersistentModelIndex::operator_cast_to_QModelIndex(&local_48,&pPVar4->root);
          (**(code **)(*(long *)pQVar1 + 0x60))(&local_a8,pQVar1,index,iVar2,&local_48);
          QPersistentModelIndex::operator=(&((this->d).d)->topItemIndex,&local_a8);
          setCurrentIndex(this,index);
          return;
        }
      }
    }
    setCurrentIndex(this,-1);
    local_a8.r = -1;
    local_a8.c = -1;
    local_a8.i._0_4_ = 0;
    local_a8.i._4_4_ = 0;
    local_a8.m._0_4_ = 0;
    local_a8.m._4_4_ = 0;
    QPersistentModelIndex::operator=(&((this->d).d)->topItemIndex,&local_a8);
  }
  return;
}

Assistant:

void
Picker::setModel( QAbstractItemModel * model )
{
	if( !model )
	{
		qWarning( "QtMWidgets::Picker::setModel: cannot set a 0 model" );
		return;
	}

	if( d->model )
	{
		disconnect( d->model, &QAbstractItemModel::dataChanged,
			this, &Picker::_q_dataChanged );
		disconnect( d->model, &QAbstractItemModel::rowsAboutToBeInserted,
			this, &Picker::_q_updateIndexBeforeChange );
		disconnect( d->model, &QAbstractItemModel::rowsInserted,
			this, &Picker::_q_rowsInserted );
		disconnect( d->model, &QAbstractItemModel::rowsAboutToBeRemoved,
			this, &Picker::_q_updateIndexBeforeChange );
		disconnect( d->model, &QAbstractItemModel::rowsRemoved,
			this, &Picker::_q_rowsRemoved );
		disconnect( d->model, &QAbstractItemModel::destroyed,
			this, &Picker::_q_modelDestroyed );
		disconnect( d->model, &QAbstractItemModel::modelAboutToBeReset,
			this, &Picker::_q_updateIndexBeforeChange );
		disconnect( d->model, &QAbstractItemModel::modelReset,
			this, &Picker::_q_modelReset );

		if( d->model->QObject::parent() == this )
			delete d->model;
	}

	d->model = model;

	connect( model, &QAbstractItemModel::dataChanged,
		this, &Picker::_q_dataChanged );
	connect( model, &QAbstractItemModel::rowsAboutToBeInserted,
		this, &Picker::_q_updateIndexBeforeChange );
	connect( model, &QAbstractItemModel::rowsInserted,
		this, &Picker::_q_rowsInserted );
	connect( model, &QAbstractItemModel::rowsAboutToBeRemoved,
		this, &Picker::_q_updateIndexBeforeChange );
	connect( model, &QAbstractItemModel::rowsRemoved,
		this, &Picker::_q_rowsRemoved );
	connect( model, &QAbstractItemModel::destroyed,
		this, &Picker::_q_modelDestroyed );
	connect( model, &QAbstractItemModel::modelAboutToBeReset,
		this, &Picker::_q_updateIndexBeforeChange );
	connect( model, &QAbstractItemModel::modelReset,
		this, &Picker::_q_modelReset );

	bool currentReset = false;

	if( count() )
	{
		for( int pos = 0; pos < count(); ++pos )
		{
			if( d->model->index( pos, d->modelColumn, d->root ).flags() & Qt::ItemIsEnabled )
			{
				d->topItemIndex = d->model->index( pos, d->modelColumn, d->root );
				setCurrentIndex( pos );
				currentReset = true;
				break;
			}
		}
	}

	if( !currentReset )
	{
		setCurrentIndex( -1 );
		d->topItemIndex = QModelIndex();
	}
}